

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O0

void __thiscall Material::passToShader(Material *this)

{
  tvec3<float,_(glm::precision)0> *ptVar1;
  tvec4<float,_(glm::precision)0> *ptVar2;
  PFNGLGETUNIFORMLOCATIONPROC p_Var3;
  PFNGLUNIFORM1FPROC p_Var4;
  PFNGLUNIFORM1IPROC p_Var5;
  PFNGLUNIFORM3FPROC p_Var6;
  PFNGLUNIFORM4FPROC p_Var7;
  PFNGLUNIFORMMATRIX4FVPROC p_Var8;
  bool bVar9;
  GLuint GVar10;
  GLint GVar11;
  pointer ppVar12;
  pointer ppVar13;
  pointer ppVar14;
  col_type *this_00;
  float *pfVar15;
  pointer ppVar16;
  pointer ppVar17;
  pointer ppVar18;
  GLchar *pGVar19;
  _Self local_120;
  _Base_ptr local_118;
  int local_10c;
  iterator iStack_108;
  int textureIndex;
  iterator itt;
  _Self local_f8;
  _Base_ptr local_f0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*>_>
  local_e8;
  iterator iti;
  _Self local_d8;
  _Base_ptr local_d0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>
  local_c8;
  iterator itf;
  undefined1 local_b8 [8];
  mat4 mat;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>
  local_68;
  iterator itm4;
  vec4 *vec_1;
  _Base_ptr local_48;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*>_>
  local_40;
  iterator itv4;
  vec3 *vec;
  _Base_ptr local_20;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>
  local_18;
  iterator itv3;
  Material *this_local;
  
  itv3._M_node = (_Base_ptr)this;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>
  ::_Rb_tree_iterator(&local_18);
  local_20 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>_>
             ::begin(&this->vec3Uniforms);
  local_18._M_node = local_20;
  while( true ) {
    vec = (vec3 *)std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>_>
                  ::end(&this->vec3Uniforms);
    bVar9 = std::operator!=(&local_18,(_Self *)&vec);
    if (!bVar9) break;
    ppVar12 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>
              ::operator->(&local_18);
    p_Var6 = __glewUniform3f;
    p_Var3 = __glewGetUniformLocation;
    ptVar1 = ppVar12->second;
    GVar10 = Shader::getProgramId(this->shader);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>
    ::operator->(&local_18);
    pGVar19 = (GLchar *)std::__cxx11::string::c_str();
    GVar11 = (*p_Var3)(GVar10,pGVar19);
    (*p_Var6)(GVar11,(ptVar1->field_0).field_0.x,(ptVar1->field_0).field_0.y,
              (ptVar1->field_0).field_0.z);
    itv4._M_node = (_Base_ptr)
                   std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec3<float,_(glm::precision)0>_*>_>
                   ::operator++(&local_18,0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*>_>
  ::_Rb_tree_iterator(&local_40);
  local_48 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*>_>_>
             ::begin(&this->vec4Uniforms);
  local_40._M_node = local_48;
  while( true ) {
    vec_1 = (vec4 *)std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*>_>_>
                    ::end(&this->vec4Uniforms);
    bVar9 = std::operator!=(&local_40,(_Self *)&vec_1);
    if (!bVar9) break;
    ppVar13 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*>_>
              ::operator->(&local_40);
    p_Var7 = __glewUniform4f;
    p_Var3 = __glewGetUniformLocation;
    ptVar2 = ppVar13->second;
    GVar10 = Shader::getProgramId(this->shader);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*>_>
    ::operator->(&local_40);
    pGVar19 = (GLchar *)std::__cxx11::string::c_str();
    GVar11 = (*p_Var3)(GVar10,pGVar19);
    (*p_Var7)(GVar11,(ptVar2->field_0).field_0.x,(ptVar2->field_0).field_0.y,
              (ptVar2->field_0).field_0.z,(ptVar2->field_0).field_0.w);
    itm4._M_node = (_Base_ptr)
                   std::
                   _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tvec4<float,_(glm::precision)0>_*>_>
                   ::operator++(&local_40,0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>
  ::_Rb_tree_iterator(&local_68);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>_>
       ::begin(&this->mat4Uniforms);
  while( true ) {
    mat.value[3].field_0._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>_>
         ::end(&this->mat4Uniforms);
    bVar9 = std::operator!=(&local_68,(_Self *)((long)&mat.value[3].field_0 + 8));
    if (!bVar9) break;
    ppVar14 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>
              ::operator->(&local_68);
    memcpy(local_b8,ppVar14->second,0x40);
    p_Var8 = __glewUniformMatrix4fv;
    p_Var3 = __glewGetUniformLocation;
    GVar10 = Shader::getProgramId(this->shader);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>
    ::operator->(&local_68);
    pGVar19 = (GLchar *)std::__cxx11::string::c_str();
    GVar11 = (*p_Var3)(GVar10,pGVar19);
    this_00 = glm::tmat4x4<float,_(glm::precision)0>::operator[]
                        ((tmat4x4<float,_(glm::precision)0> *)local_b8,0);
    pfVar15 = glm::tvec4<float,_(glm::precision)0>::operator[](this_00,0);
    (*p_Var8)(GVar11,1,'\0',pfVar15);
    itf._M_node = (_Base_ptr)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>
                  ::operator++(&local_68,0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>
  ::_Rb_tree_iterator(&local_c8);
  local_d0 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>_>
             ::begin(&this->floatUniforms);
  local_c8._M_node = local_d0;
  while( true ) {
    local_d8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>_>
         ::end(&this->floatUniforms);
    bVar9 = std::operator!=(&local_c8,&local_d8);
    p_Var4 = __glewUniform1f;
    p_Var3 = __glewGetUniformLocation;
    if (!bVar9) break;
    GVar10 = Shader::getProgramId(this->shader);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>
    ::operator->(&local_c8);
    pGVar19 = (GLchar *)std::__cxx11::string::c_str();
    GVar11 = (*p_Var3)(GVar10,pGVar19);
    ppVar16 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>
              ::operator->(&local_c8);
    (*p_Var4)(GVar11,*ppVar16->second);
    iti._M_node = (_Base_ptr)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_float_*>_>
                  ::operator++(&local_c8,0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*>_>
  ::_Rb_tree_iterator(&local_e8);
  local_f0 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*>_>_>
             ::begin(&this->intUniforms);
  local_e8._M_node = local_f0;
  while( true ) {
    local_f8._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*>_>_>
         ::end(&this->intUniforms);
    bVar9 = std::operator!=(&local_e8,&local_f8);
    p_Var4 = __glewUniform1f;
    p_Var3 = __glewGetUniformLocation;
    if (!bVar9) break;
    GVar10 = Shader::getProgramId(this->shader);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*>_>
    ::operator->(&local_e8);
    pGVar19 = (GLchar *)std::__cxx11::string::c_str();
    GVar11 = (*p_Var3)(GVar10,pGVar19);
    ppVar17 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*>_>
              ::operator->(&local_e8);
    (*p_Var4)(GVar11,(float)*ppVar17->second);
    itt._M_node = (_Base_ptr)
                  std::
                  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int_*>_>
                  ::operator++(&local_e8,0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*>_>
  ::_Rb_tree_iterator(&stack0xfffffffffffffef8);
  local_10c = 0;
  local_118 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*>_>_>
              ::begin(&this->textureUniforms);
  iStack_108 = (iterator)local_118;
  while( true ) {
    local_120._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*>_>_>
         ::end(&this->textureUniforms);
    bVar9 = std::operator!=(&stack0xfffffffffffffef8,&local_120);
    if (!bVar9) break;
    (*__glewActiveTexture)(local_10c + 0x84c0);
    ppVar18 = std::
              _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*>_>
              ::operator->(&stack0xfffffffffffffef8);
    GVar10 = Texture::getTextureBuffer(ppVar18->second);
    glBindTexture(0xde1,GVar10);
    p_Var5 = __glewUniform1i;
    p_Var3 = __glewGetUniformLocation;
    GVar10 = Shader::getProgramId(this->shader);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*>_>
    ::operator->(&stack0xfffffffffffffef8);
    pGVar19 = (GLchar *)std::__cxx11::string::c_str();
    GVar11 = (*p_Var3)(GVar10,pGVar19);
    (*p_Var5)(GVar11,local_10c);
    local_10c = local_10c + 1;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Texture_*>_>
    ::operator++(&stack0xfffffffffffffef8,0);
  }
  return;
}

Assistant:

void Material::passToShader()
{
	std::map<std::string, glm::vec3*>::iterator itv3;
	for (itv3 = vec3Uniforms.begin(); itv3 != vec3Uniforms.end(); itv3++)
	{
		glm::vec3* vec = itv3->second;
		glUniform3f(glGetUniformLocation(shader->getProgramId(), itv3->first.c_str()), vec->x, vec->y, vec->z);
	}

	std::map<std::string, glm::vec4*>::iterator itv4;
	for (itv4 = vec4Uniforms.begin(); itv4 != vec4Uniforms.end(); itv4++)
	{
		glm::vec4* vec = itv4->second;
		glUniform4f(glGetUniformLocation(shader->getProgramId(), itv4->first.c_str()), vec->x, vec->y, vec->z, vec->w);
	}

	std::map<std::string, glm::mat4*>::iterator itm4;
	for (itm4 = mat4Uniforms.begin(); itm4 != mat4Uniforms.end(); itm4++)
	{
		glm::mat4 mat = *itm4->second;
		glUniformMatrix4fv(glGetUniformLocation(shader->getProgramId(), itm4->first.c_str()), 1, GL_FALSE, &mat[0][0]);
	}

	std::map<std::string, float*>::iterator itf;
	for (itf = floatUniforms.begin(); itf != floatUniforms.end(); itf++)
	{
		glUniform1f(glGetUniformLocation(shader->getProgramId(), itf->first.c_str()), *itf->second);
	}

	std::map<std::string, int*>::iterator iti;
	for (iti = intUniforms.begin(); iti != intUniforms.end(); iti++)
	{
		glUniform1f(glGetUniformLocation(shader->getProgramId(), iti->first.c_str()), *iti->second);
	}


	std::map<std::string, Texture*>::iterator itt;
	int textureIndex = 0;
	for (itt = textureUniforms.begin(); itt != textureUniforms.end(); itt++)
	{
		glActiveTexture(GL_TEXTURE0 + textureIndex);
		glBindTexture(GL_TEXTURE_2D, itt->second->getTextureBuffer());
		glUniform1i(glGetUniformLocation(shader->getProgramId(), itt->first.c_str()), textureIndex);
		textureIndex++;
	}

}